

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Main.c
# Opt level: O1

void event_roll_call(tgestate_t *state)

{
  char cVar1;
  vischar_t *pvVar2;
  uint8_t *puVar3;
  
  if (((byte)((state->hero_mappos).u + 0x84) < 0xf6) ||
     ((byte)((state->hero_mappos).v + 0x8e) < 0xf8)) {
    state->bell = '\0';
    queue_message(state,message_MISSED_ROLL_CALL);
    pvVar2 = state->vischars;
    cVar1 = -7;
    do {
      pvVar2 = pvVar2 + 1;
      if ((pvVar2->character < 0x14) && ((pvVar2->mi).mappos.w < 0x20)) {
        pvVar2->flags = '\x01';
      }
      cVar1 = cVar1 + '\x01';
    } while (cVar1 != '\0');
  }
  else {
    puVar3 = &state->vischars[0].direction;
    cVar1 = -8;
    do {
      *(undefined2 *)(puVar3 + -1) = 0x380;
      puVar3 = puVar3 + 0x40;
      cVar1 = cVar1 + '\x01';
    } while (cVar1 != '\0');
  }
  return;
}

Assistant:

void event_roll_call(tgestate_t *state)
{
  uint16_t   range;   /* was DE */ // pos8_t?
  uint8_t   *pcoord;  /* was HL */
  uint8_t    iters;   /* was B */
  uint8_t    coord;   /* was A */
  vischar_t *vischar; /* was HL */

  assert(state != NULL);

  /* Is the hero within the roll call area bounds? */
  /* Conv: Unrolled. */
  /* Range checking. X in (114..124) and Y in (106..114). */
  range = map_ROLL_CALL_X;
  pcoord = &state->hero_mappos.u;
  coord = *pcoord++;
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    goto not_at_roll_call;

  range = map_ROLL_CALL_Y;
  coord = *pcoord++; // -> state->hero_map_position.y
  if (coord < ((range >> 8) & 0xFF) || coord >= ((range >> 0) & 0xFF))
    goto not_at_roll_call;

  /* All visible characters turn forward. */
  vischar = &state->vischars[0];
  iters = vischars_LENGTH;
  do
  {
    vischar->input = input_KICK;
    vischar->direction = direction_BOTTOM_LEFT;
    vischar++;
  }
  while (--iters);

  return;

not_at_roll_call:
  state->bell = bell_RING_PERPETUAL;
  queue_message(state, message_MISSED_ROLL_CALL);
  hostiles_pursue(state); /* was tail call */
}